

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O0

void dwt_per_stride(double *inp,int N,double *lpd,double *hpd,int lpd_len,double *cA,int len_cA,
                   double *cD,int istride,int ostride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int os;
  int is;
  int len_avg;
  int t;
  int i;
  int isodd;
  int l2;
  int l;
  double *cA_local;
  int lpd_len_local;
  double *hpd_local;
  double *lpd_local;
  int N_local;
  double *inp_local;
  
  iVar1 = lpd_len / 2;
  iVar5 = N % 2;
  for (len_avg = 0; len_avg < len_cA; len_avg = len_avg + 1) {
    iVar2 = len_avg * 2 + iVar1;
    iVar3 = len_avg * ostride;
    cA[iVar3] = 0.0;
    cD[iVar3] = 0.0;
    for (isodd = 0; isodd < lpd_len; isodd = isodd + 1) {
      if ((iVar2 - isodd < iVar1) || (N <= iVar2 - isodd)) {
        if ((iVar2 - isodd < iVar1) && (-1 < iVar2 - isodd)) {
          iVar4 = (iVar2 - isodd) * istride;
          cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
          cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
        }
        else if ((iVar2 - isodd < 0) && (iVar5 == 0)) {
          iVar4 = ((iVar2 - isodd) + N) * istride;
          cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
          cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
        }
        else if ((iVar2 - isodd < 0) && (iVar5 == 1)) {
          if (iVar2 - isodd == -1) {
            iVar4 = (N + -1) * istride;
            cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
            cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
          }
          else {
            iVar4 = ((iVar2 - isodd) + N + 1) * istride;
            cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
            cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
          }
        }
        else if ((iVar2 - isodd < N) || (iVar5 != 0)) {
          if ((N <= iVar2 - isodd) && (iVar5 == 1)) {
            iVar4 = ((iVar2 - isodd) - (N + 1)) * istride;
            if (iVar2 - isodd == N) {
              iVar4 = (N + -1) * istride;
              cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
              cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
            }
            else {
              cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
              cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
            }
          }
        }
        else {
          iVar4 = ((iVar2 - isodd) - N) * istride;
          cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
          cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
        }
      }
      else {
        iVar4 = (iVar2 - isodd) * istride;
        cA[iVar3] = lpd[isodd] * inp[iVar4] + cA[iVar3];
        cD[iVar3] = hpd[isodd] * inp[iVar4] + cD[iVar3];
      }
    }
  }
  return;
}

Assistant:

void dwt_per_stride(double *inp, int N, double *lpd,double*hpd,int lpd_len,double *cA, int len_cA, double *cD, int istride, int ostride) {
	int l, l2, isodd, i, t, len_avg,is,os;

	len_avg = lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		os = i *ostride;
		cA[os] = 0.0;
		cD[os] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 0) {
				is = (t - l + N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					is = (t - l + N + 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				is = (t - l - N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) >= N && isodd == 1) {
				is = (t - l - (N + 1)) * istride;
				if (t - l != N) {
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}

		}
		
	}

}